

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void * producer_fun(void *params)

{
  bool bVar1;
  Bucket *this;
  Object obj;
  Object local_28;
  
  this = FastQueue::enqueue(fastqueue);
  local_28.len = 0x40;
  local_28.addr = data;
  do {
    while( true ) {
      bVar1 = Bucket::store(this,&local_28);
      if (!bVar1) break;
      *(long *)params = *params + 1;
    }
    Bucket::releaseBucket(this);
    this = FastQueue::enqueue(fastqueue);
  } while( true );
}

Assistant:

void* producer_fun(void* params){

    Bucket* bucket = fastqueue->enqueue();
    Object obj(data, (int)DATA_LEN);
    
    uint64_t* num = (uint64_t*)params;
    bool flag;

    while(true){
        flag = bucket->store(obj);
        if(!flag){
            bucket->releaseBucket();
            bucket = fastqueue->enqueue();
            continue;
        }
	    (*num)++;
    }
   
}